

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

Expr * inclusive_or_expr(void)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Expr *new;
  Expr *left;
  Expr *local_8;
  
  local_8 = exclusive_or_expr();
  skip();
  while( true ) {
    bVar3 = false;
    if (*s == '|') {
      bVar3 = s[1] != '|';
    }
    if (!bVar3) break;
    s = s + 1;
    skip();
    pEVar1 = new_expr();
    pEVar1->type = 10;
    skip();
    pEVar1->left = local_8;
    pEVar2 = exclusive_or_expr();
    pEVar1->right = pEVar2;
    local_8 = pEVar1;
  }
  return local_8;
}

Assistant:

static struct Expr *inclusive_or_expr(void)
{
  struct Expr *left,*new;

  left = exclusive_or_expr();
  skip();
  while (s[0]=='|' && s[1]!='|') {
    s++;
    skip();
    new = new_expr();
    new->type = BOR;
    skip();
    new->left = left;
    new->right = exclusive_or_expr();
    left = new;
  }
  return left;
}